

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.h
# Opt level: O2

char * __thiscall
btGeneric6DofConstraint::serialize
          (btGeneric6DofConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  long lVar1;
  long lVar2;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btTransform::serialize(&this->m_frameInA,(btTransformFloatData *)((long)dataBuffer + 0x40));
  btTransform::serialize(&this->m_frameInB,(btTransformFloatData *)((long)dataBuffer + 0x80));
  lVar2 = 0;
  for (lVar1 = -0xc0; lVar1 != 0; lVar1 = lVar1 + 0x40) {
    *(undefined4 *)((long)dataBuffer + lVar2 + 0xf0) =
         *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats + lVar1 + -4)
    ;
    *(undefined4 *)((long)dataBuffer + lVar2 + 0xe0) =
         *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats + lVar1);
    *(undefined4 *)((long)dataBuffer + lVar2 + 0xd0) =
         *(undefined4 *)((long)(this->m_linearLimits).m_lowerLimit.m_floats + lVar2);
    *(undefined4 *)((long)dataBuffer + lVar2 + 0xc0) =
         *(undefined4 *)((long)(this->m_linearLimits).m_upperLimit.m_floats + lVar2);
    lVar2 = lVar2 + 4;
  }
  *(uint *)((long)dataBuffer + 0x100) = (uint)this->m_useLinearReferenceFrameA;
  *(uint *)((long)dataBuffer + 0x104) = (uint)this->m_useOffsetForConstraintFrame;
  return "btGeneric6DofConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btGeneric6DofConstraintData2* dof = (btGeneric6DofConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

		
	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i] =  m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i] =  m_angularLimits[i].m_hiLimit;
		dof->m_linearLowerLimit.m_floats[i] = m_linearLimits.m_lowerLimit[i];
		dof->m_linearUpperLimit.m_floats[i] = m_linearLimits.m_upperLimit[i];
	}
	
	dof->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA? 1 : 0;
	dof->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame ? 1 : 0;

	return btGeneric6DofConstraintDataName;
}